

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
::LogConstraintGroup
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>_>
           *this,BasicFlatModelAPI *be)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  BasicLogger *pBVar4;
  string_view key;
  string_view key_00;
  string_view key_01;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter wrt;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_288;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_278;
  char *local_268;
  undefined8 uStack_260;
  BasicMemoryWriter<char,_std::allocator<char>_> local_250;
  
  pBVar4 = (this->super_BasicConstraintKeeper).exporter_;
  if (pBVar4 == (BasicLogger *)0x0) {
    return;
  }
  iVar2 = (*pBVar4->_vptr_BasicLogger[2])();
  if ((char)iVar2 != '\0') {
    if ((this->super_BasicConstraintKeeper).exporter_ != (BasicLogger *)0x0) {
      local_250.super_BasicWriter<char>.buffer_ = &local_250.buffer_.super_Buffer<char>;
      local_250.super_BasicWriter<char>._vptr_BasicWriter =
           (_func_int **)&PTR__BasicMemoryWriter_005c3958;
      pcVar1 = local_250.buffer_.data_;
      local_250.buffer_.super_Buffer<char>.size_ = 0;
      local_250.buffer_.super_Buffer<char>.capacity_ = 500;
      local_250.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
      local_278.wrt_ = &local_250;
      local_278.kind_ = Unset;
      local_278.n_written_ = 0;
      local_250.buffer_.super_Buffer<char>.ptr_ = pcVar1;
      pcVar3 = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
      key._M_str = (char *)0x8;
      key._M_len = (size_t)&local_278;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_288,key);
      if (local_288.kind_ == Unset) {
        local_288.kind_ = Scalar;
      }
      local_268 = pcVar3;
      fmt::BasicWriter<char>::write
                (&(local_288.wrt_)->super_BasicWriter<char>,0x4a01ca,(void *)0xa,(size_t)&local_268)
      ;
      local_288.n_written_ = local_288.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_288);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_288);
      pcVar3 = ConGroupName(0);
      key_00._M_str = (char *)0x9;
      key_00._M_len = (size_t)&local_278;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_288,key_00);
      if (local_288.kind_ == Unset) {
        local_288.kind_ = Scalar;
      }
      local_268 = pcVar3;
      fmt::BasicWriter<char>::write
                (&(local_288.wrt_)->super_BasicWriter<char>,0x4a01ca,(void *)0xa,(size_t)&local_268)
      ;
      local_288.n_written_ = local_288.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_288);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_288);
      key_01._M_str = (char *)0xf;
      key_01._M_len = (size_t)&local_278;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_288,key_01);
      if (local_288.kind_ == Unset) {
        local_288.kind_ = Scalar;
      }
      local_268 = (char *)0x0;
      fmt::BasicWriter<char>::write
                (&(local_288.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)&local_268)
      ;
      local_288.n_written_ = local_288.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_288);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_288);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_278);
      local_268 = (char *)0x0;
      uStack_260 = 0;
      fmt::BasicWriter<char>::write
                (&local_250.super_BasicWriter<char>,0x4b6c83,(void *)0x0,(size_t)&local_268);
      pBVar4 = (this->super_BasicConstraintKeeper).exporter_;
      if ((pBVar4 == (BasicLogger *)0x0) ||
         (iVar2 = (*pBVar4->_vptr_BasicLogger[2])(), (char)iVar2 == '\0')) {
        pBVar4 = (BasicLogger *)0x0;
      }
      else {
        pBVar4 = (this->super_BasicConstraintKeeper).exporter_;
      }
      BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>(pBVar4,&local_250);
      local_250.super_BasicWriter<char>._vptr_BasicWriter =
           (_func_int **)&PTR__BasicMemoryWriter_005c3958;
      local_250.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
      if (local_250.buffer_.super_Buffer<char>.ptr_ != pcVar1) {
        operator_delete(local_250.buffer_.super_Buffer<char>.ptr_,
                        local_250.buffer_.super_Buffer<char>.capacity_);
      }
      return;
    }
    return;
  }
  return;
}

Assistant:

void LogConstraintGroup(
      BasicFlatModelAPI& be) override {
    auto cg = GetConstraintGroup(be);
    if (cg>=0 && GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["CON_GROUP"] = ConGroupName(cg);
        jw["CON_GROUP_index"] = cg;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }